

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O1

void __thiscall Assimp::ColladaExporter::WriteHeader(ColladaExporter *this)

{
  undefined1 *puVar1;
  size_type sVar2;
  uint *puVar3;
  aiScene *paVar4;
  byte bVar5;
  ColladaExporter *pCVar6;
  int iVar7;
  tm *__tp;
  aiNode *this_00;
  aiNode **ppaVar8;
  ostream *poVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__n;
  ulong uVar10;
  ostream *poVar11;
  byte extraout_DL;
  byte extraout_DL_00;
  ulong uVar12;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  size_t sVar13;
  aiMetadata *paVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ColladaExporter *this_01;
  long lVar16;
  char *pcVar17;
  ulong uVar18;
  byte bVar19;
  bool bVar20;
  float fVar21;
  aiQuaternion rotation;
  string up_axis;
  aiVector3D position;
  aiVector3D scaling;
  char date_str [20];
  time_t date;
  aiString value;
  string local_950;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_930;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_920;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_910;
  ostream *local_908;
  ColladaExporter *local_900;
  aiQuaterniont<float> local_8f4;
  float local_8e4;
  string local_8e0;
  long *local_8c0;
  char *local_8b8;
  long local_8b0 [2];
  aiVector3t<float> local_8a0;
  aiVector3t<float> local_894;
  long *local_888;
  ulong local_880;
  long local_878 [2];
  char local_868 [32];
  time_t local_848;
  string local_840 [32];
  undefined8 local_438;
  
  if (WriteHeader()::epsilon == '\0') {
    WriteHeader();
  }
  if (WriteHeader()::x_rot == '\0') {
    WriteHeader();
  }
  if (WriteHeader()::y_rot == '\0') {
    WriteHeader();
  }
  if (WriteHeader()::z_rot == '\0') {
    WriteHeader();
  }
  local_848 = time((time_t *)0x0);
  __tp = localtime(&local_848);
  strftime(local_868,0x14,"%Y-%m-%dT%H:%M:%S",__tp);
  local_894.x = 0.0;
  local_894.y = 0.0;
  local_894.z = 0.0;
  local_8f4.w = 1.0;
  local_8f4.x = 0.0;
  local_8f4.y = 0.0;
  local_8f4.z = 0.0;
  local_8a0.x = 0.0;
  local_8a0.y = 0.0;
  local_8a0.z = 0.0;
  aiMatrix4x4t<float>::Decompose
            (&this->mScene->mRootNode->mTransformation,&local_894,&local_8f4,&local_8a0);
  fVar21 = local_8f4.w * local_8f4.w +
           local_8f4.z * local_8f4.z + local_8f4.x * local_8f4.x + local_8f4.y * local_8f4.y;
  if (fVar21 < 0.0) {
    fVar21 = sqrtf(fVar21);
  }
  else {
    fVar21 = SQRT(fVar21);
  }
  if ((fVar21 != 0.0) || (NAN(fVar21))) {
    fVar21 = 1.0 / fVar21;
    local_8f4.x = local_8f4.x * fVar21;
    local_8f4.y = local_8f4.y * fVar21;
    local_8f4.z = local_8f4.z * fVar21;
    local_8f4.w = fVar21 * local_8f4.w;
  }
  local_8e4 = 1.0;
  bVar19 = 1;
  if (((ABS(local_894.x - local_894.y) <= WriteHeader::epsilon) &&
      (ABS(local_894.x - local_894.z) <= WriteHeader::epsilon)) &&
     (ABS(local_894.y - local_894.z) <= WriteHeader::epsilon)) {
    local_8e4 = (local_894.z + local_894.y + local_894.x) / 3.0;
    bVar19 = 0;
  }
  local_8c0 = local_8b0;
  pcVar17 = "Y_UP";
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8c0,"Y_UP","");
  if (((WriteHeader::epsilon < ABS(local_8f4.x - WriteHeader::x_rot.x)) ||
      (WriteHeader::epsilon < ABS(local_8f4.y - WriteHeader::x_rot.y))) ||
     ((WriteHeader::epsilon < ABS(local_8f4.z - WriteHeader::x_rot.z) ||
      (WriteHeader::epsilon < ABS(local_8f4.w - WriteHeader::x_rot.w))))) {
    if (((WriteHeader::epsilon < ABS(local_8f4.x - WriteHeader::y_rot.x)) ||
        (WriteHeader::epsilon < ABS(local_8f4.y - WriteHeader::y_rot.y))) ||
       ((WriteHeader::epsilon < ABS(local_8f4.z - WriteHeader::y_rot.z) ||
        (WriteHeader::epsilon < ABS(local_8f4.w - WriteHeader::y_rot.w))))) {
      bVar5 = 1;
      if ((((WriteHeader::epsilon < ABS(local_8f4.x - WriteHeader::z_rot.x)) ||
           (WriteHeader::epsilon < ABS(local_8f4.y - WriteHeader::z_rot.y))) ||
          (WriteHeader::epsilon < ABS(local_8f4.z - WriteHeader::z_rot.z))) ||
         (WriteHeader::epsilon < ABS(local_8f4.w - WriteHeader::z_rot.w))) goto LAB_00317084;
      pcVar17 = "Z_UP";
    }
  }
  else {
    pcVar17 = "X_UP";
  }
  std::__cxx11::string::_M_replace((ulong)&local_8c0,0,local_8b8,(ulong)pcVar17);
  bVar5 = bVar19;
LAB_00317084:
  bVar20 = true;
  if ((ABS(local_8a0.x) <= 1e-06) && (ABS(local_8a0.y) <= 1e-06)) {
    bVar20 = (bool)(1e-06 < ABS(local_8a0.z) | bVar5);
  }
  if ((this->mScene->mRootNode->mNumChildren == 0) || (bVar20)) {
    SceneCombiner::CopyScene((aiScene **)&local_438,this->mScene,true);
    this_00 = (aiNode *)operator_new(0x478);
    local_840[0]._M_dataplus._M_p = (pointer)&local_840[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_840,"Scene","");
    aiNode::aiNode(this_00,local_840);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
      operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1);
    }
    this_00->mNumChildren = 1;
    ppaVar8 = (aiNode **)operator_new__(8);
    this_00->mChildren = ppaVar8;
    paVar4 = (aiScene *)CONCAT44(local_438._4_4_,(uint)local_438);
    *ppaVar8 = paVar4->mRootNode;
    paVar4->mRootNode->mParent = this_00;
    paVar4->mRootNode = this_00;
    this->mScene = paVar4;
    this->mSceneOwned = true;
    std::__cxx11::string::_M_replace((ulong)&local_8c0,0,local_8b8,0x6c8e20);
    local_8e4 = 1.0;
  }
  puVar1 = &this->field_0x38;
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<asset>",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__cxx11::string::append((char *)&this->startstr);
  __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)__n->_M_local_buf,"<contributor>",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)__n->_M_local_buf,(this->endstr)._M_dataplus._M_p,
             (this->endstr)._M_string_length);
  std::__cxx11::string::append((char *)&this->startstr);
  paVar14 = this->mScene->mMetaData;
  if (paVar14 == (aiMetadata *)0x0) {
    paVar14 = this->mScene->mRootNode->mMetaData;
  }
  local_438._0_4_ = 0;
  local_438._4_4_ = local_438._4_4_ & 0xffffff00;
  memset((void *)((long)&local_438 + 5),0x1b,0x3ff);
  local_908 = (ostream *)puVar1;
  local_900 = this;
  if (paVar14 == (aiMetadata *)0x0) {
    bVar19 = 1;
  }
  else {
    local_888 = local_878;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_888,"Author","");
    sVar13 = 0x3ff;
    if ((local_880 & 0xfffffc00) == 0) {
      sVar13 = local_880 & 0xffffffff;
    }
    local_840[0]._M_dataplus._M_p._0_4_ = (uint)sVar13;
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),local_888,sVar13);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar13 + 4) = 0;
    uVar10 = (ulong)paVar14->mNumProperties;
    bVar20 = uVar10 != 0;
    bVar19 = extraout_DL;
    if (bVar20) {
      __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(uVar10 << 4);
      pcVar17 = paVar14->mKeys->data;
      bVar20 = true;
      uVar18 = 1;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      do {
        uVar12 = (ulong)((aiString *)(pcVar17 + -4))->length;
        if ((((aiString *)(pcVar17 + -4))->length == (uint)sVar13) &&
           (iVar7 = bcmp(pcVar17,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),uVar12),
           uVar12 = extraout_RDX, iVar7 == 0)) {
          if (*(int *)(paVar15->_M_local_buf + (long)&paVar14->mValues->mType) == 5) {
            puVar3 = *(uint **)((long)&paVar14->mValues->mData + (long)paVar15);
            bVar19 = 1;
            if (puVar3 != (uint *)&local_438) {
              local_438._0_4_ = *puVar3;
              __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ulong)(uint)local_438;
              memcpy((void *)((long)&local_438 + 4),puVar3 + 1,(size_t)__n);
              bVar19 = 1;
              *(string *)(__n->_M_local_buf + (long)&local_438 + 4) = (string)0x0;
            }
          }
          else {
            bVar19 = 0;
          }
          break;
        }
        bVar19 = (byte)uVar12;
        bVar20 = uVar18 < uVar10;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar15->_M_local_buf + 0x10);
        uVar18 = uVar18 + 1;
        pcVar17 = pcVar17 + 0x404;
      } while (__n != paVar15);
    }
    bVar19 = bVar20 & bVar19 ^ 1;
  }
  this_01 = local_900;
  poVar9 = local_908;
  if ((paVar14 != (aiMetadata *)0x0) && (local_888 != local_878)) {
    operator_delete(local_888,local_878[0] + 1);
  }
  pcVar17 = (this_01->startstr)._M_dataplus._M_p;
  sVar2 = (this_01->startstr)._M_string_length;
  if (bVar19 == 0) {
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar17,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"<author>",8);
    __n = &local_8e0.field_2;
    pcVar17 = (char *)((long)&local_438 + 4);
    local_8e0._M_dataplus._M_p = (pointer)__n;
    sVar13 = strlen(pcVar17);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e0,pcVar17,pcVar17 + sVar13);
    XMLEscape(local_840,&local_8e0);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"</author>",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,(this_01->endstr)._M_dataplus._M_p,(this_01->endstr)._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
      operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8e0._M_dataplus._M_p != __n) {
      operator_delete(local_8e0._M_dataplus._M_p,local_8e0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar17,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"<author>",8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Assimp",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"</author>",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,(this_01->endstr)._M_dataplus._M_p,(this_01->endstr)._M_string_length);
  }
  if (paVar14 == (aiMetadata *)0x0) {
    bVar19 = 1;
  }
  else {
    local_8e0._M_dataplus._M_p = (pointer)&local_8e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_8e0,"SourceAsset_Generator","")
    ;
    sVar13 = 0x3ff;
    if ((local_8e0._M_string_length & 0xfffffc00) == 0) {
      sVar13 = local_8e0._M_string_length & 0xffffffff;
    }
    local_840[0]._M_dataplus._M_p._0_4_ = (uint)sVar13;
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),local_8e0._M_dataplus._M_p,sVar13);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar13 + 4) = 0;
    uVar10 = (ulong)paVar14->mNumProperties;
    bVar20 = uVar10 != 0;
    bVar19 = extraout_DL_00;
    if (bVar20) {
      __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(uVar10 << 4);
      pcVar17 = paVar14->mKeys->data;
      bVar20 = true;
      uVar18 = 1;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
      do {
        uVar12 = (ulong)((aiString *)(pcVar17 + -4))->length;
        if ((((aiString *)(pcVar17 + -4))->length == (uint)sVar13) &&
           (iVar7 = bcmp(pcVar17,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),uVar12),
           uVar12 = extraout_RDX_00, iVar7 == 0)) {
          if (*(int *)(paVar15->_M_local_buf + (long)&paVar14->mValues->mType) == 5) {
            puVar3 = *(uint **)((long)&paVar14->mValues->mData + (long)paVar15);
            bVar19 = 1;
            if (puVar3 != (uint *)&local_438) {
              local_438._0_4_ = *puVar3;
              __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ulong)(uint)local_438;
              memcpy((void *)((long)&local_438 + 4),puVar3 + 1,(size_t)__n);
              bVar19 = 1;
              *(string *)(__n->_M_local_buf + (long)&local_438 + 4) = (string)0x0;
            }
          }
          else {
            bVar19 = 0;
          }
          break;
        }
        bVar19 = (byte)uVar12;
        bVar20 = uVar18 < uVar10;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar15->_M_local_buf + 0x10);
        uVar18 = uVar18 + 1;
        pcVar17 = pcVar17 + 0x404;
      } while (__n != paVar15);
    }
    bVar19 = bVar20 & bVar19 ^ 1;
    poVar9 = local_908;
    this_01 = local_900;
  }
  if ((paVar14 != (aiMetadata *)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e0._M_dataplus._M_p != &local_8e0.field_2)) {
    operator_delete(local_8e0._M_dataplus._M_p,local_8e0.field_2._M_allocated_capacity + 1);
  }
  pcVar17 = (this_01->startstr)._M_dataplus._M_p;
  sVar2 = (this_01->startstr)._M_string_length;
  if (bVar19 == 0) {
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar17,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"<authoring_tool>",0x10);
    __n = &local_920;
    pcVar17 = (char *)((long)&local_438 + 4);
    local_930._M_allocated_capacity = (size_type)__n;
    sVar13 = strlen(pcVar17);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_930,pcVar17,pcVar17 + sVar13);
    XMLEscape(local_840,(string *)&local_930);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"</authoring_tool>",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,(this_01->endstr)._M_dataplus._M_p,(this_01->endstr)._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
      operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_930._M_allocated_capacity != __n) {
      operator_delete((void *)local_930._M_allocated_capacity,local_920._M_allocated_capacity + 1);
    }
  }
  else {
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar17,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"<authoring_tool>",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Assimp Exporter",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"</authoring_tool>",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,(this_01->endstr)._M_dataplus._M_p,(this_01->endstr)._M_string_length);
  }
  if (paVar14 != (aiMetadata *)0x0) {
    local_930._M_allocated_capacity = (size_type)&local_920;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_930,"Comments","");
    sVar13 = 0x3ff;
    if ((local_930._8_8_ & 0xfffffc00) == 0) {
      sVar13 = local_930._8_8_ & 0xffffffff;
    }
    local_840[0]._M_dataplus._M_p._0_4_ = (uint)sVar13;
    local_910 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_930._M_allocated_capacity;
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),
           (void *)local_930._M_allocated_capacity,sVar13);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar13 + 4) = 0;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(ulong)paVar14->mNumProperties;
    bVar20 = paVar15 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    if (bVar20) {
      pcVar17 = paVar14->mKeys->data;
      bVar20 = true;
      __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x1;
      lVar16 = 0;
      do {
        if ((((aiString *)(pcVar17 + -4))->length == (uint)sVar13) &&
           (iVar7 = bcmp(pcVar17,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),
                         (ulong)((aiString *)(pcVar17 + -4))->length),
           this_01 = (ColladaExporter *)((long)paVar15 << 4), iVar7 == 0)) {
          if (*(int *)(lVar16 + (long)&paVar14->mValues->mType) == 5) {
            puVar3 = *(uint **)((long)&paVar14->mValues->mData + lVar16);
            this_01 = (ColladaExporter *)0x1;
            if (puVar3 != (uint *)&local_438) {
              local_438._0_4_ = *puVar3;
              uVar10 = (ulong)(uint)local_438;
              memcpy((void *)((long)&local_438 + 4),puVar3 + 1,uVar10);
              *(undefined1 *)((long)&local_438 + uVar10 + 4) = 0;
            }
          }
          else {
            this_01 = (ColladaExporter *)0x0;
          }
          break;
        }
        bVar20 = __n < paVar15;
        lVar16 = lVar16 + 0x10;
        __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(__n->_M_local_buf + 1);
        pcVar17 = pcVar17 + 0x404;
      } while ((ColladaExporter *)((long)paVar15 << 4) != (ColladaExporter *)lVar16);
    }
    if (local_910 != &local_920) {
      operator_delete(local_910,local_920._M_allocated_capacity + 1);
    }
    pCVar6 = local_900;
    if ((bVar20 & (byte)this_01) != 0) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_908,(local_900->startstr)._M_dataplus._M_p,
                          (local_900->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<comments>",10);
      __n = &local_930;
      local_930._M_allocated_capacity = (size_type)&local_920;
      pcVar17 = (char *)((long)&local_438 + 4);
      sVar13 = strlen(pcVar17);
      std::__cxx11::string::_M_construct<char_const*>((string *)__n,pcVar17,pcVar17 + sVar13);
      XMLEscape(local_840,(string *)&local_930);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"</comments>",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,(pCVar6->endstr)._M_dataplus._M_p,(pCVar6->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
        operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_930._M_allocated_capacity != &local_920) {
        operator_delete((void *)local_930._M_allocated_capacity,local_920._M_allocated_capacity + 1)
        ;
      }
    }
    local_930._M_allocated_capacity = (size_type)&local_920;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_930,"SourceAsset_Copyright","")
    ;
    sVar13 = 0x3ff;
    if ((local_930._8_8_ & 0xfffffc00) == 0) {
      sVar13 = local_930._8_8_ & 0xffffffff;
    }
    local_840[0]._M_dataplus._M_p._0_4_ = (uint)sVar13;
    local_910 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_930._M_allocated_capacity;
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),
           (void *)local_930._M_allocated_capacity,sVar13);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar13 + 4) = 0;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(ulong)paVar14->mNumProperties;
    bVar20 = paVar15 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    if (bVar20) {
      pcVar17 = paVar14->mKeys->data;
      bVar20 = true;
      __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x1;
      lVar16 = 0;
      do {
        if ((((aiString *)(pcVar17 + -4))->length == (uint)sVar13) &&
           (iVar7 = bcmp(pcVar17,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),
                         (ulong)((aiString *)(pcVar17 + -4))->length),
           this_01 = (ColladaExporter *)((long)paVar15 << 4), iVar7 == 0)) {
          if (*(int *)(lVar16 + (long)&paVar14->mValues->mType) == 5) {
            puVar3 = *(uint **)((long)&paVar14->mValues->mData + lVar16);
            this_01 = (ColladaExporter *)0x1;
            if (puVar3 != (uint *)&local_438) {
              local_438._0_4_ = *puVar3;
              uVar10 = (ulong)(uint)local_438;
              memcpy((void *)((long)&local_438 + 4),puVar3 + 1,uVar10);
              *(undefined1 *)((long)&local_438 + uVar10 + 4) = 0;
            }
          }
          else {
            this_01 = (ColladaExporter *)0x0;
          }
          break;
        }
        bVar20 = __n < paVar15;
        lVar16 = lVar16 + 0x10;
        __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)__n + 1);
        pcVar17 = pcVar17 + 0x404;
      } while ((ColladaExporter *)((long)paVar15 << 4) != (ColladaExporter *)lVar16);
    }
    bVar19 = (byte)this_01;
    if (local_910 != &local_920) {
      operator_delete(local_910,local_920._M_allocated_capacity + 1);
    }
    pCVar6 = local_900;
    if ((bVar20 & bVar19) != 0) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_908,(local_900->startstr)._M_dataplus._M_p,
                          (local_900->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<copyright>",0xb);
      __n = &local_930;
      local_930._M_allocated_capacity = (size_type)&local_920;
      pcVar17 = (char *)((long)&local_438 + 4);
      sVar13 = strlen(pcVar17);
      std::__cxx11::string::_M_construct<char_const*>((string *)__n,pcVar17,pcVar17 + sVar13);
      XMLEscape(local_840,(string *)&local_930);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"</copyright>",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,(pCVar6->endstr)._M_dataplus._M_p,(pCVar6->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
        operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_930._M_allocated_capacity != &local_920) {
        operator_delete((void *)local_930._M_allocated_capacity,local_920._M_allocated_capacity + 1)
        ;
      }
    }
    local_930._M_allocated_capacity = (size_type)&local_920;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_930,"SourceData","");
    sVar13 = 0x3ff;
    if ((local_930._8_8_ & 0xfffffc00) == 0) {
      sVar13 = local_930._8_8_ & 0xffffffff;
    }
    local_840[0]._M_dataplus._M_p._0_4_ = (uint)sVar13;
    local_910 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_930._M_allocated_capacity;
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),
           (void *)local_930._M_allocated_capacity,sVar13);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar13 + 4) = 0;
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(ulong)paVar14->mNumProperties;
    bVar20 = paVar15 !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
    if (bVar20) {
      pcVar17 = paVar14->mKeys->data;
      bVar20 = true;
      __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x1;
      lVar16 = 0;
      do {
        if ((((aiString *)(pcVar17 + -4))->length == (uint)sVar13) &&
           (iVar7 = bcmp(pcVar17,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),
                         (ulong)((aiString *)(pcVar17 + -4))->length),
           this_01 = (ColladaExporter *)((long)paVar15 << 4), iVar7 == 0)) {
          if (*(int *)(lVar16 + (long)&paVar14->mValues->mType) == 5) {
            puVar3 = *(uint **)((long)&paVar14->mValues->mData + lVar16);
            bVar19 = 1;
            if (puVar3 != (uint *)&local_438) {
              local_438._0_4_ = *puVar3;
              uVar10 = (ulong)(uint)local_438;
              memcpy((void *)((long)&local_438 + 4),puVar3 + 1,uVar10);
              *(undefined1 *)((long)&local_438 + uVar10 + 4) = 0;
            }
          }
          else {
            bVar19 = 0;
          }
          break;
        }
        bVar19 = (byte)this_01;
        bVar20 = __n < paVar15;
        lVar16 = lVar16 + 0x10;
        __n = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((long)__n + 1);
        pcVar17 = pcVar17 + 0x404;
      } while ((ColladaExporter *)((long)paVar15 << 4) != (ColladaExporter *)lVar16);
    }
    if (local_910 != &local_920) {
      operator_delete(local_910,local_920._M_allocated_capacity + 1);
    }
    this_01 = local_900;
    poVar9 = local_908;
    if ((bVar20 & bVar19) != 0) {
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_908,(local_900->startstr)._M_dataplus._M_p,
                           (local_900->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"<source_data>",0xd);
      __n = &local_930;
      local_930._M_allocated_capacity = (size_type)&local_920;
      pcVar17 = (char *)((long)&local_438 + 4);
      sVar13 = strlen(pcVar17);
      std::__cxx11::string::_M_construct<char_const*>((string *)__n,pcVar17,pcVar17 + sVar13);
      XMLEscape(local_840,(string *)&local_930);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"</source_data>",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,(this_01->endstr)._M_dataplus._M_p,(this_01->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
        operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_930._M_allocated_capacity != &local_920) {
        operator_delete((void *)local_930._M_allocated_capacity,local_920._M_allocated_capacity + 1)
        ;
      }
    }
  }
  bVar19 = (byte)__n;
  PopTag(this_01);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,(this_01->startstr)._M_dataplus._M_p,
                       (this_01->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"</contributor>",0xe);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,(this_01->endstr)._M_dataplus._M_p,(this_01->endstr)._M_string_length);
  if (paVar14 == (aiMetadata *)0x0) {
    bVar19 = 1;
  }
  else {
    local_930._M_allocated_capacity = (size_type)&local_920;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_930,"Created","");
    sVar13 = 0x3ff;
    if ((local_930._8_8_ & 0xfffffc00) == 0) {
      sVar13 = local_930._8_8_ & 0xffffffff;
    }
    local_840[0]._M_dataplus._M_p._0_4_ = (uint)sVar13;
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),
           (void *)local_930._M_allocated_capacity,sVar13);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar13 + 4) = 0;
    uVar10 = (ulong)paVar14->mNumProperties;
    bVar20 = uVar10 != 0;
    if (bVar20) {
      pcVar17 = paVar14->mKeys->data;
      paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x1;
      uVar18 = 1;
      lVar16 = 0;
      do {
        if ((((aiString *)(pcVar17 + -4))->length == (uint)sVar13) &&
           (iVar7 = bcmp(pcVar17,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),
                         (ulong)((aiString *)(pcVar17 + -4))->length), __n = paVar15, iVar7 == 0)) {
          bVar20 = SUB81(paVar15,0);
          if (*(int *)((long)&paVar14->mValues->mType + lVar16) == 5) {
            puVar3 = *(uint **)((long)&paVar14->mValues->mData + lVar16);
            bVar19 = 1;
            if (puVar3 != (uint *)&local_438) {
              local_438._0_4_ = *puVar3;
              uVar10 = (ulong)(uint)local_438;
              memcpy((void *)((long)&local_438 + 4),puVar3 + 1,uVar10);
              *(undefined1 *)((long)&local_438 + uVar10 + 4) = 0;
            }
          }
          else {
            bVar19 = 0;
          }
          break;
        }
        bVar19 = (byte)__n;
        bVar20 = uVar18 < uVar10;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(ulong)bVar20;
        lVar16 = lVar16 + 0x10;
        uVar18 = uVar18 + 1;
        pcVar17 = pcVar17 + 0x404;
      } while (uVar10 << 4 != lVar16);
    }
    bVar19 = bVar20 & bVar19 ^ 1;
    poVar9 = local_908;
    this_01 = local_900;
  }
  if ((paVar14 != (aiMetadata *)0x0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_930._M_allocated_capacity != &local_920)) {
    operator_delete((void *)local_930._M_allocated_capacity,local_920._M_allocated_capacity + 1);
  }
  pcVar17 = (this_01->startstr)._M_dataplus._M_p;
  sVar2 = (this_01->startstr)._M_string_length;
  if (bVar19 == 0) {
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar17,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"<created>",9);
    pcVar17 = (char *)((long)&local_438 + 4);
    local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
    sVar13 = strlen(pcVar17);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,pcVar17,pcVar17 + sVar13);
    XMLEscape(local_840,&local_950);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"</created>",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,(this_01->endstr)._M_dataplus._M_p,(this_01->endstr)._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
      operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_950._M_dataplus._M_p != &local_950.field_2) {
      operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar17,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"<created>",9);
    sVar13 = strlen(local_868);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_868,sVar13);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"</created>",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,(this_01->endstr)._M_dataplus._M_p,(this_01->endstr)._M_string_length);
  }
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,(this_01->startstr)._M_dataplus._M_p,
                       (this_01->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"<modified>",10);
  sVar13 = strlen(local_868);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,local_868,sVar13);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"</modified>",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,(this_01->endstr)._M_dataplus._M_p,(this_01->endstr)._M_string_length);
  if (paVar14 != (aiMetadata *)0x0) {
    local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,"Keywords","");
    sVar13 = 0x3ff;
    if ((local_950._M_string_length & 0xfffffc00) == 0) {
      sVar13 = local_950._M_string_length & 0xffffffff;
    }
    local_840[0]._M_dataplus._M_p._0_4_ = (uint)sVar13;
    local_910 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_950._M_dataplus._M_p;
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),local_950._M_dataplus._M_p,sVar13);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar13 + 4) = 0;
    uVar10 = (ulong)paVar14->mNumProperties;
    bVar20 = uVar10 != 0;
    if (bVar20) {
      pcVar17 = paVar14->mKeys->data;
      bVar20 = true;
      uVar18 = 1;
      lVar16 = 0;
      do {
        if ((((aiString *)(pcVar17 + -4))->length == (uint)sVar13) &&
           (iVar7 = bcmp(pcVar17,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),
                         (ulong)((aiString *)(pcVar17 + -4))->length),
           this_01 = (ColladaExporter *)(uVar10 << 4), iVar7 == 0)) {
          if (*(int *)(lVar16 + (long)&paVar14->mValues->mType) == 5) {
            puVar3 = *(uint **)((long)&paVar14->mValues->mData + lVar16);
            this_01 = (ColladaExporter *)0x1;
            if (puVar3 != (uint *)&local_438) {
              local_438._0_4_ = *puVar3;
              uVar10 = (ulong)(uint)local_438;
              memcpy((void *)((long)&local_438 + 4),puVar3 + 1,uVar10);
              *(undefined1 *)((long)&local_438 + uVar10 + 4) = 0;
            }
          }
          else {
            this_01 = (ColladaExporter *)0x0;
          }
          break;
        }
        bVar20 = uVar18 < uVar10;
        lVar16 = lVar16 + 0x10;
        uVar18 = uVar18 + 1;
        pcVar17 = pcVar17 + 0x404;
      } while ((ColladaExporter *)(uVar10 << 4) != (ColladaExporter *)lVar16);
    }
    if (local_910 != &local_950.field_2) {
      operator_delete(local_910,local_950.field_2._M_allocated_capacity + 1);
    }
    pCVar6 = local_900;
    if ((bVar20 & (byte)this_01) != 0) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_908,(local_900->startstr)._M_dataplus._M_p,
                          (local_900->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<keywords>",10);
      local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
      pcVar17 = (char *)((long)&local_438 + 4);
      sVar13 = strlen(pcVar17);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,pcVar17,pcVar17 + sVar13)
      ;
      XMLEscape(local_840,&local_950);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"</keywords>",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,(pCVar6->endstr)._M_dataplus._M_p,(pCVar6->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
        operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_950._M_dataplus._M_p != &local_950.field_2) {
        operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
      }
    }
    local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,"Revision","");
    sVar13 = 0x3ff;
    if ((local_950._M_string_length & 0xfffffc00) == 0) {
      sVar13 = local_950._M_string_length & 0xffffffff;
    }
    local_840[0]._M_dataplus._M_p._0_4_ = (uint)sVar13;
    local_910 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_950._M_dataplus._M_p;
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),local_950._M_dataplus._M_p,sVar13);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar13 + 4) = 0;
    uVar10 = (ulong)paVar14->mNumProperties;
    bVar20 = uVar10 != 0;
    if (bVar20) {
      pcVar17 = paVar14->mKeys->data;
      bVar20 = true;
      uVar18 = 1;
      lVar16 = 0;
      do {
        if ((((aiString *)(pcVar17 + -4))->length == (uint)sVar13) &&
           (iVar7 = bcmp(pcVar17,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),
                         (ulong)((aiString *)(pcVar17 + -4))->length),
           this_01 = (ColladaExporter *)(uVar10 << 4), iVar7 == 0)) {
          if (*(int *)(lVar16 + (long)&paVar14->mValues->mType) == 5) {
            puVar3 = *(uint **)((long)&paVar14->mValues->mData + lVar16);
            this_01 = (ColladaExporter *)0x1;
            if (puVar3 != (uint *)&local_438) {
              local_438._0_4_ = *puVar3;
              uVar10 = (ulong)(uint)local_438;
              memcpy((void *)((long)&local_438 + 4),puVar3 + 1,uVar10);
              *(undefined1 *)((long)&local_438 + uVar10 + 4) = 0;
            }
          }
          else {
            this_01 = (ColladaExporter *)0x0;
          }
          break;
        }
        bVar20 = uVar18 < uVar10;
        lVar16 = lVar16 + 0x10;
        uVar18 = uVar18 + 1;
        pcVar17 = pcVar17 + 0x404;
      } while ((ColladaExporter *)(uVar10 << 4) != (ColladaExporter *)lVar16);
    }
    if (local_910 != &local_950.field_2) {
      operator_delete(local_910,local_950.field_2._M_allocated_capacity + 1);
    }
    pCVar6 = local_900;
    if ((bVar20 & (byte)this_01) != 0) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_908,(local_900->startstr)._M_dataplus._M_p,
                          (local_900->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<revision>",10);
      local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
      pcVar17 = (char *)((long)&local_438 + 4);
      sVar13 = strlen(pcVar17);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,pcVar17,pcVar17 + sVar13)
      ;
      XMLEscape(local_840,&local_950);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"</revision>",0xb);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,(pCVar6->endstr)._M_dataplus._M_p,(pCVar6->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
        operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_950._M_dataplus._M_p != &local_950.field_2) {
        operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
      }
    }
    local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,"Subject","");
    sVar13 = 0x3ff;
    if ((local_950._M_string_length & 0xfffffc00) == 0) {
      sVar13 = local_950._M_string_length & 0xffffffff;
    }
    local_840[0]._M_dataplus._M_p._0_4_ = (uint)sVar13;
    local_910 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_950._M_dataplus._M_p;
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),local_950._M_dataplus._M_p,sVar13);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar13 + 4) = 0;
    uVar10 = (ulong)paVar14->mNumProperties;
    bVar20 = uVar10 != 0;
    if (bVar20) {
      pcVar17 = paVar14->mKeys->data;
      bVar20 = true;
      uVar18 = 1;
      lVar16 = 0;
      do {
        if ((((aiString *)(pcVar17 + -4))->length == (uint)sVar13) &&
           (iVar7 = bcmp(pcVar17,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),
                         (ulong)((aiString *)(pcVar17 + -4))->length),
           this_01 = (ColladaExporter *)(uVar10 << 4), iVar7 == 0)) {
          if (*(int *)(lVar16 + (long)&paVar14->mValues->mType) == 5) {
            puVar3 = *(uint **)((long)&paVar14->mValues->mData + lVar16);
            this_01 = (ColladaExporter *)0x1;
            if (puVar3 != (uint *)&local_438) {
              local_438._0_4_ = *puVar3;
              uVar10 = (ulong)(uint)local_438;
              memcpy((void *)((long)&local_438 + 4),puVar3 + 1,uVar10);
              *(undefined1 *)((long)&local_438 + uVar10 + 4) = 0;
            }
          }
          else {
            this_01 = (ColladaExporter *)0x0;
          }
          break;
        }
        bVar20 = uVar18 < uVar10;
        lVar16 = lVar16 + 0x10;
        uVar18 = uVar18 + 1;
        pcVar17 = pcVar17 + 0x404;
      } while ((ColladaExporter *)(uVar10 << 4) != (ColladaExporter *)lVar16);
    }
    bVar19 = (byte)this_01;
    if (local_910 != &local_950.field_2) {
      operator_delete(local_910,local_950.field_2._M_allocated_capacity + 1);
    }
    pCVar6 = local_900;
    if ((bVar20 & bVar19) != 0) {
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_908,(local_900->startstr)._M_dataplus._M_p,
                          (local_900->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"<subject>",9);
      local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
      pcVar17 = (char *)((long)&local_438 + 4);
      sVar13 = strlen(pcVar17);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,pcVar17,pcVar17 + sVar13)
      ;
      XMLEscape(local_840,&local_950);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"</subject>",10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,(pCVar6->endstr)._M_dataplus._M_p,(pCVar6->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
        operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_950._M_dataplus._M_p != &local_950.field_2) {
        operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
      }
    }
    local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,"Title","");
    sVar13 = 0x3ff;
    if ((local_950._M_string_length & 0xfffffc00) == 0) {
      sVar13 = local_950._M_string_length & 0xffffffff;
    }
    local_840[0]._M_dataplus._M_p._0_4_ = (uint)sVar13;
    local_910 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_950._M_dataplus._M_p;
    memcpy((void *)((long)&local_840[0]._M_dataplus._M_p + 4),local_950._M_dataplus._M_p,sVar13);
    *(undefined1 *)((long)&local_840[0]._M_dataplus._M_p + sVar13 + 4) = 0;
    uVar10 = (ulong)paVar14->mNumProperties;
    bVar20 = uVar10 != 0;
    if (bVar20) {
      pcVar17 = paVar14->mKeys->data;
      bVar20 = true;
      uVar18 = 1;
      lVar16 = 0;
      do {
        if ((((aiString *)(pcVar17 + -4))->length == (uint)sVar13) &&
           (iVar7 = bcmp(pcVar17,(void *)((long)&local_840[0]._M_dataplus._M_p + 4),
                         (ulong)((aiString *)(pcVar17 + -4))->length),
           this_01 = (ColladaExporter *)(uVar10 << 4), iVar7 == 0)) {
          if (*(int *)(lVar16 + (long)&paVar14->mValues->mType) == 5) {
            puVar3 = *(uint **)((long)&paVar14->mValues->mData + lVar16);
            bVar19 = 1;
            if (puVar3 != (uint *)&local_438) {
              local_438._0_4_ = *puVar3;
              uVar10 = (ulong)(uint)local_438;
              memcpy((void *)((long)&local_438 + 4),puVar3 + 1,uVar10);
              *(undefined1 *)((long)&local_438 + uVar10 + 4) = 0;
            }
          }
          else {
            bVar19 = 0;
          }
          break;
        }
        bVar19 = (byte)this_01;
        bVar20 = uVar18 < uVar10;
        lVar16 = lVar16 + 0x10;
        uVar18 = uVar18 + 1;
        pcVar17 = pcVar17 + 0x404;
      } while ((ColladaExporter *)(uVar10 << 4) != (ColladaExporter *)lVar16);
    }
    if (local_910 != &local_950.field_2) {
      operator_delete(local_910,local_950.field_2._M_allocated_capacity + 1);
    }
    this_01 = local_900;
    poVar9 = local_908;
    if ((bVar20 & bVar19) != 0) {
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_908,(local_900->startstr)._M_dataplus._M_p,
                           (local_900->startstr)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"<title>",7);
      local_950._M_dataplus._M_p = (pointer)&local_950.field_2;
      pcVar17 = (char *)((long)&local_438 + 4);
      sVar13 = strlen(pcVar17);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_950,pcVar17,pcVar17 + sVar13)
      ;
      XMLEscape(local_840,&local_950);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,local_840[0]._M_dataplus._M_p,local_840[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"</title>",8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,(this_01->endstr)._M_dataplus._M_p,(this_01->endstr)._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_840[0]._M_dataplus._M_p != &local_840[0].field_2) {
        operator_delete(local_840[0]._M_dataplus._M_p,local_840[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_950._M_dataplus._M_p != &local_950.field_2) {
        operator_delete(local_950._M_dataplus._M_p,local_950.field_2._M_allocated_capacity + 1);
      }
    }
  }
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,(this_01->startstr)._M_dataplus._M_p,
                       (this_01->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"<unit name=\"meter\" meter=\"",0x1a);
  poVar11 = std::ostream::_M_insert<double>((double)local_8e4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" />",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,(this_01->endstr)._M_dataplus._M_p,(this_01->endstr)._M_string_length);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar9,(this_01->startstr)._M_dataplus._M_p,
                       (this_01->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"<up_axis>",9);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,(char *)local_8c0,(long)local_8b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"</up_axis>",10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,(this_01->endstr)._M_dataplus._M_p,(this_01->endstr)._M_string_length);
  PopTag(this_01);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(this_01->startstr)._M_dataplus._M_p,
                      (this_01->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"</asset>",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar9,(this_01->endstr)._M_dataplus._M_p,(this_01->endstr)._M_string_length);
  if (local_8c0 != local_8b0) {
    operator_delete(local_8c0,local_8b0[0] + 1);
  }
  return;
}

Assistant:

void ColladaExporter::WriteHeader() {
    static const ai_real epsilon = Math::getEpsilon<ai_real>();
    static const aiQuaternion x_rot(aiMatrix3x3(
        0, -1,  0,
        1,  0,  0,
        0,  0,  1));
    static const aiQuaternion y_rot(aiMatrix3x3(
        1,  0,  0,
        0,  1,  0,
        0,  0,  1));
    static const aiQuaternion z_rot(aiMatrix3x3(
        1,  0,  0,
        0,  0,  1,
        0, -1,  0));

    static const unsigned int date_nb_chars = 20;
    char date_str[date_nb_chars];
    std::time_t date = std::time(NULL);
    std::strftime(date_str, date_nb_chars, "%Y-%m-%dT%H:%M:%S", std::localtime(&date));

    aiVector3D scaling;
    aiQuaternion rotation;
    aiVector3D position;
    mScene->mRootNode->mTransformation.Decompose(scaling, rotation, position);
    rotation.Normalize();

    bool add_root_node = false;

    ai_real scale = 1.0;
    if(std::abs(scaling.x - scaling.y) <= epsilon && std::abs(scaling.x - scaling.z) <= epsilon && std::abs(scaling.y - scaling.z) <= epsilon) {
        scale = (ai_real) ((((double) scaling.x) + ((double) scaling.y) + ((double) scaling.z)) / 3.0);
    } else {
        add_root_node = true;
    }

    std::string up_axis = "Y_UP";
    if(rotation.Equal(x_rot, epsilon)) {
        up_axis = "X_UP";
    } else if(rotation.Equal(y_rot, epsilon)) {
        up_axis = "Y_UP";
    } else if(rotation.Equal(z_rot, epsilon)) {
        up_axis = "Z_UP";
    } else {
        add_root_node = true;
    }

    if(! position.Equal(aiVector3D(0, 0, 0))) {
        add_root_node = true;
    }

    if(mScene->mRootNode->mNumChildren == 0) {
        add_root_node = true;
    }

    if(add_root_node) {
        aiScene* scene;
        SceneCombiner::CopyScene(&scene, mScene);

        aiNode* root = new aiNode("Scene");

        root->mNumChildren = 1;
        root->mChildren = new aiNode*[root->mNumChildren];

        root->mChildren[0] = scene->mRootNode;
        scene->mRootNode->mParent = root;
        scene->mRootNode = root;

        mScene = scene;
        mSceneOwned = true;

        up_axis = "Y_UP";
        scale = 1.0;
    }

    mOutput << startstr << "<asset>" << endstr;
    PushTag();
    mOutput << startstr << "<contributor>" << endstr;
    PushTag();

    // If no Scene metadata, use root node metadata
    aiMetadata* meta = mScene->mMetaData;
    if (nullptr == meta) {
        meta = mScene->mRootNode->mMetaData;
    }

    aiString value;
    if (!meta || !meta->Get("Author", value)) {
        mOutput << startstr << "<author>" << "Assimp" << "</author>" << endstr;
    } else {
        mOutput << startstr << "<author>" << XMLEscape(value.C_Str()) << "</author>" << endstr;
    }

    if (nullptr == meta || !meta->Get(AI_METADATA_SOURCE_GENERATOR, value)) {
        mOutput << startstr << "<authoring_tool>" << "Assimp Exporter" << "</authoring_tool>" << endstr;
    } else {
        mOutput << startstr << "<authoring_tool>" << XMLEscape(value.C_Str()) << "</authoring_tool>" << endstr;
    }

    if (meta) {
        if (meta->Get("Comments", value)) {
            mOutput << startstr << "<comments>" << XMLEscape(value.C_Str()) << "</comments>" << endstr;
        }
        if (meta->Get(AI_METADATA_SOURCE_COPYRIGHT, value)) {
            mOutput << startstr << "<copyright>" << XMLEscape(value.C_Str()) << "</copyright>" << endstr;
        }
        if (meta->Get("SourceData", value)) {
            mOutput << startstr << "<source_data>" << XMLEscape(value.C_Str()) << "</source_data>" << endstr;
        }
    }

    PopTag();
    mOutput << startstr << "</contributor>" << endstr;

    if (nullptr == meta || !meta->Get("Created", value)) {
        mOutput << startstr << "<created>" << date_str << "</created>" << endstr;
    } else {
        mOutput << startstr << "<created>" << XMLEscape(value.C_Str()) << "</created>" << endstr;
    }

    // Modified date is always the date saved
    mOutput << startstr << "<modified>" << date_str << "</modified>" << endstr;

    if (meta) {
        if (meta->Get("Keywords", value)) {
            mOutput << startstr << "<keywords>" << XMLEscape(value.C_Str()) << "</keywords>" << endstr;
        }
        if (meta->Get("Revision", value)) {
            mOutput << startstr << "<revision>" << XMLEscape(value.C_Str()) << "</revision>" << endstr;
        }
        if (meta->Get("Subject", value)) {
            mOutput << startstr << "<subject>" << XMLEscape(value.C_Str()) << "</subject>" << endstr;
        }
        if (meta->Get("Title", value)) {
            mOutput << startstr << "<title>" << XMLEscape(value.C_Str()) << "</title>" << endstr;
        }
    }

    mOutput << startstr << "<unit name=\"meter\" meter=\"" << scale << "\" />" << endstr;
    mOutput << startstr << "<up_axis>" << up_axis << "</up_axis>" << endstr;
    PopTag();
    mOutput << startstr << "</asset>" << endstr;
}